

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O1

argParserAdvancedConfiguration * __thiscall
argParserAdvancedConfiguration::asFile(argParserAdvancedConfiguration *this)

{
  ((this->newargconfig->
   super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
   )._M_impl.super__Vector_impl_data._M_finish[-1]->arguments->
  super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  )._M_impl.super__Vector_impl_data._M_finish[-1]->enumIsFile = true;
  return this;
}

Assistant:

argParserAdvancedConfiguration *argParserAdvancedConfiguration::asFile() {
    newargconfig->back()->arguments->back()->enumIsFile = true;
    return this;
}